

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O0

int __thiscall
TPZStructMatrix::ComputeElementColors(TPZStructMatrix *this,TPZVec<int> *elementcolors)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  size_type sVar4;
  int64_t numelem;
  int64_t iVar5;
  long lVar6;
  long *plVar7;
  TPZVec<int> *in_RSI;
  int64_t in_RDI;
  int64_t ic;
  int inod;
  int64_t lastnode;
  int64_t firstnode;
  int icolor_1;
  bool color_found;
  int icolor;
  int64_t el;
  int max_color;
  int min_color;
  int highest_color;
  bool element_not_colored;
  int64_t nel;
  TPZGenMatrix<long> domain;
  int color_stored;
  int64_t nconnects;
  TPZVec<long> elgraphindex;
  TPZStack<long,_10> elgraph;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  TPZVec<long> *in_stack_fffffffffffffe80;
  TPZGenMatrix<long> *in_stack_fffffffffffffe88;
  TPZStack<long,_10> *in_stack_fffffffffffffe90;
  int64_t in_stack_fffffffffffffe98;
  TPZGenMatrix<long> *in_stack_fffffffffffffea0;
  int *in_stack_fffffffffffffec8;
  TPZVec<int> *in_stack_fffffffffffffed0;
  int local_124;
  int local_10c;
  long local_100;
  undefined4 in_stack_ffffffffffffff10;
  int iVar8;
  undefined4 in_stack_ffffffffffffff14;
  int iVar9;
  undefined4 in_stack_ffffffffffffff18;
  uint uVar10;
  undefined4 in_stack_ffffffffffffff1c;
  TPZCompMesh *in_stack_ffffffffffffff20;
  TPZGenMatrix<long> local_d8;
  undefined4 local_bc;
  int64_t local_b8;
  TPZVec<long> local_a0;
  TPZVec<long> local_80 [2];
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  TPZVec<long> *in_stack_ffffffffffffffd0;
  TPZStack<long,_10> *in_stack_ffffffffffffffd8;
  TPZCompMesh *in_stack_ffffffffffffffe0;
  
  TPZStack<long,_10>::TPZStack(in_stack_fffffffffffffe90);
  TPZVec<long>::TPZVec(&local_a0);
  sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1d7090e);
  if (sVar4 == 0) {
    TPZCompMesh::ComputeElGraph
              (in_stack_ffffffffffffff20,
               (TPZStack<long,_10> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (TPZVec<long> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  }
  else {
    TPZCompMesh::ComputeElGraph
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8);
  }
  numelem = TPZCompMesh::NConnects((TPZCompMesh *)0x1d7099c);
  local_bc = 10;
  local_b8 = numelem;
  TPZGenMatrix<long>::TPZGenMatrix
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(int64_t)in_stack_fffffffffffffe90)
  ;
  iVar5 = TPZVec<long>::size(&local_a0);
  lVar6 = iVar5 + -1;
  (*in_RSI->_vptr_TPZVec[4])(in_RSI,lVar6);
  TPZVec<int>::Fill(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_RDI,numelem);
  uVar10 = 0x1000000;
  iVar9 = 0;
  iVar8 = 0;
  do {
    if ((uVar10 & 0x1000000) == 0) {
      TPZGenMatrix<long>::~TPZGenMatrix((TPZGenMatrix<long> *)in_stack_fffffffffffffe80);
      TPZVec<long>::~TPZVec(in_stack_fffffffffffffe80);
      TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1d70d19);
      return iVar9;
    }
    uVar10 = 0;
    for (local_100 = 0; local_100 < lVar6; local_100 = local_100 + 1) {
      bVar3 = true;
      for (local_10c = 0; local_10c < 10; local_10c = local_10c + 1) {
        bVar3 = true;
        plVar7 = TPZVec<long>::operator[](&local_a0,local_100);
        lVar1 = *plVar7;
        plVar7 = TPZVec<long>::operator[](&local_a0,local_100 + 1);
        lVar2 = *plVar7;
        for (local_124 = (int)lVar1; local_124 < lVar2; local_124 = local_124 + 1) {
          TPZVec<long>::operator[](local_80,(long)local_124);
          plVar7 = TPZGenMatrix<long>::operator()
                             (in_stack_fffffffffffffe88,(int64_t)in_stack_fffffffffffffe80,
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          if (*plVar7 != 0) {
            bVar3 = false;
            break;
          }
          in_stack_fffffffffffffe88 =
               (TPZGenMatrix<long> *)
               TPZGenMatrix<long>::operator()
                         (in_stack_fffffffffffffe88,(int64_t)in_stack_fffffffffffffe80,
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          in_stack_fffffffffffffe88->fMem = (long *)0x1;
        }
        if (bVar3) {
          in_stack_fffffffffffffe7c = iVar8 + local_10c;
          in_stack_fffffffffffffe80 = (TPZVec<long> *)TPZVec<int>::operator[](in_RSI,local_100);
          *(int *)&in_stack_fffffffffffffe80->_vptr_TPZVec = in_stack_fffffffffffffe7c;
          if (iVar9 < iVar8 + local_10c) {
            iVar9 = iVar8 + local_10c;
          }
          break;
        }
      }
      if (!bVar3) {
        uVar10 = 0x1000000;
      }
    }
    iVar8 = iVar8 + 10;
    TPZGenMatrix<long>::Fill(&local_d8,(long *)&stack0xfffffffffffffec8);
  } while( true );
}

Assistant:

int TPZStructMatrix::ComputeElementColors(TPZVec<int> &elementcolors)
{
    TPZStack<int64_t> elgraph;
    TPZVec<int64_t> elgraphindex;
    if(!fMaterialIds.size())
    {
        fMesh->ComputeElGraph(elgraph, elgraphindex);
    }
    else
    {
        fMesh->ComputeElGraph(elgraph, elgraphindex, fMaterialIds);
    }
    int64_t nconnects = fMesh->NConnects();
    const int color_stored = 10;
    TPZGenMatrix<int64_t> domain(nconnects,color_stored);
    int64_t nel = elgraphindex.size()-1;
    elementcolors.resize(nel);
    elementcolors.Fill(-1);
    bool element_not_colored = true;
    int highest_color = 0;
    int min_color = 0;
    int max_color = min_color+color_stored;
    while(element_not_colored)
    {
        element_not_colored = false;
        for (int64_t el = 0; el<nel; el++) {
            int icolor;
            bool color_found = true;
            for(int icolor = 0; icolor<color_stored; icolor++)
            {
                color_found = true;
                int64_t firstnode = elgraphindex[el];
                int64_t lastnode = elgraphindex[el+1];
                for (int inod = firstnode; inod < lastnode; inod++) {
                    int64_t ic = elgraph[inod];
                    if(domain(ic,icolor) != 0)
                    {
                        color_found = false;
                        break;
                    }
                    domain(ic,icolor) = 1;
                }
                if(color_found == true)
                {
                    elementcolors[el] = min_color+icolor;
                    if(min_color+icolor > highest_color) highest_color = min_color+icolor;
                    break;
                }
            }
            // the element didn't fit any color, the loop will have to be executed again
            if(!color_found) element_not_colored = true;
        }
        min_color += color_stored;
        max_color += color_stored;
        domain.Fill(0);
    }
    return highest_color;
}